

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O2

void __thiscall
FreeTypeFaceWrapper::SetupFormatSpecificExtender
          (FreeTypeFaceWrapper *this,string *inFontFilePath,string *inPFMFilePath)

{
  int iVar1;
  char *__s1;
  Trace *this_00;
  FreeTypeType1Wrapper *this_01;
  
  if (this->mFace == (FT_Face)0x0) {
    this->mFormatParticularWrapper = (IFreeTypeFaceExtender *)0x0;
  }
  else {
    __s1 = FT_Get_X11_Font_Format(this->mFace);
    iVar1 = strcmp(__s1,"Type 1");
    if (iVar1 == 0) {
      this_01 = (FreeTypeType1Wrapper *)operator_new(0x2558);
      FreeTypeType1Wrapper::FreeTypeType1Wrapper(this_01,this->mFace,inFontFilePath,inPFMFilePath);
    }
    else {
      iVar1 = strcmp(__s1,"CFF");
      if (iVar1 != 0) {
        iVar1 = strcmp(__s1,"TrueType");
        if (iVar1 != 0) {
          this->mFormatParticularWrapper = (IFreeTypeFaceExtender *)0x0;
          this_00 = Trace::DefaultTrace();
          Trace::TraceToLog(this_00,
                            "Failure in FreeTypeFaceWrapper::SetupFormatSpecificExtender, could not find format specific implementation for %s"
                            ,__s1);
          return;
        }
      }
      this_01 = (FreeTypeType1Wrapper *)operator_new(0x28);
      FreeTypeOpenTypeWrapper::FreeTypeOpenTypeWrapper
                ((FreeTypeOpenTypeWrapper *)this_01,this->mFace);
    }
    this->mFormatParticularWrapper = &this_01->super_IFreeTypeFaceExtender;
  }
  return;
}

Assistant:

void FreeTypeFaceWrapper::SetupFormatSpecificExtender(const std::string& inFontFilePath,const std::string& inPFMFilePath /*pass empty if non existant or irrelevant*/)
{
	if(mFace)
	{
		const char* fontFormat = FT_Get_X11_Font_Format(mFace);

		if(strcmp(fontFormat,scType1) == 0)
			mFormatParticularWrapper = new FreeTypeType1Wrapper(mFace,inFontFilePath,inPFMFilePath);
		else if(strcmp(fontFormat,scCFF) == 0 || strcmp(fontFormat,scTrueType) == 0)
			mFormatParticularWrapper = new FreeTypeOpenTypeWrapper(mFace);
		else
		{
			mFormatParticularWrapper = NULL;
			TRACE_LOG1("Failure in FreeTypeFaceWrapper::SetupFormatSpecificExtender, could not find format specific implementation for %s",fontFormat);
		}
	}
	else
		mFormatParticularWrapper = NULL;
		
}